

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O0

void rw::d3d8::instance(ObjPipeline *rwpipe,Atomic *atomic)

{
  Geometry *pGVar1;
  MeshHeader *this;
  InstanceDataHeader *pIVar2;
  void *pvVar3;
  uint16 *__dest;
  undefined4 uVar4;
  int local_5c;
  int32 j;
  uint16 *indices;
  Mesh *pMStack_48;
  uint32 i;
  Mesh *mesh;
  InstanceData *inst;
  MeshHeader *meshh;
  InstanceDataHeader *header;
  Geometry *geo;
  ObjPipeline *pipe;
  Atomic *atomic_local;
  ObjPipeline *rwpipe_local;
  
  pGVar1 = atomic->geometry;
  if (pGVar1->instData == (InstanceDataHeader *)0x0) {
    pIVar2 = (InstanceDataHeader *)
             mustmalloc_LOC(0x10,0x3000f,
                            "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d8.cpp line: 260"
                           );
    this = pGVar1->meshHeader;
    pGVar1->instData = pIVar2;
    pIVar2->platform = 8;
    *(uint16 *)&pIVar2[1].platform = this->serialNum;
    *(uint16 *)((long)&pIVar2[1].platform + 2) = this->numMeshes;
    pvVar3 = mustmalloc_LOC((ulong)*(ushort *)((long)&pIVar2[1].platform + 2) * 0x38,0x3000f,
                            "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d8.cpp line: 267"
                           );
    *(void **)(pIVar2 + 2) = pvVar3;
    mesh = *(Mesh **)(pIVar2 + 2);
    pMStack_48 = MeshHeader::getMeshes(this);
    for (indices._4_4_ = 0; indices._4_4_ < *(ushort *)((long)&pIVar2[1].platform + 2);
        indices._4_4_ = indices._4_4_ + 1) {
      findMinVertAndNumVertices
                (pMStack_48->indices,pMStack_48->numIndices,(uint32 *)mesh,
                 (int32 *)&mesh->numIndices);
      *(uint32 *)&mesh->field_0xc = pMStack_48->numIndices;
      mesh->material = pMStack_48->material;
      *(undefined4 *)&mesh[1].indices = 0;
      uVar4 = 4;
      if (this->flags == 1) {
        uVar4 = 5;
      }
      *(undefined4 *)((long)&mesh[1].indices + 4) = uVar4;
      mesh[1].material = (Material *)0x0;
      *(undefined4 *)&mesh[2].indices = 0;
      *(undefined1 *)((long)&mesh[2].indices + 4) = 0;
      *(undefined1 *)((long)&mesh[2].indices + 5) = 0;
      *(undefined1 *)((long)&mesh[2].indices + 6) = 0;
      pvVar3 = d3d::createIndexBuffer(*(int *)&mesh->field_0xc << 1,false);
      *(void **)&mesh[1].numIndices = pvVar3;
      __dest = d3d::lockIndices(*(void **)&mesh[1].numIndices,0,0,0);
      if (*(int *)&mesh->indices == 0) {
        memcpy(__dest,pMStack_48->indices,(long)(*(int *)&mesh->field_0xc << 1));
      }
      else {
        for (local_5c = 0; local_5c < *(int *)&mesh->field_0xc; local_5c = local_5c + 1) {
          __dest[local_5c] = pMStack_48->indices[local_5c] - (short)*(undefined4 *)&mesh->indices;
        }
      }
      d3d::unlockIndices(*(void **)&mesh[1].numIndices);
      (**(code **)&rwpipe[1].super_Pipeline)(pGVar1,mesh);
      pMStack_48 = pMStack_48 + 1;
      mesh = (Mesh *)&mesh[2].numIndices;
    }
  }
  return;
}

Assistant:

static void
instance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	// TODO: allow for REINSTANCE
	if(geo->instData)
		return;
	InstanceDataHeader *header = rwNewT(InstanceDataHeader, 1, MEMDUR_EVENT | ID_GEOMETRY);
	MeshHeader *meshh = geo->meshHeader;
	geo->instData = header;
	header->platform = PLATFORM_D3D8;

	header->serialNumber = meshh->serialNum;
	header->numMeshes = meshh->numMeshes;
	header->inst = rwNewT(InstanceData, header->numMeshes, MEMDUR_EVENT | ID_GEOMETRY);

	InstanceData *inst = header->inst;
	Mesh *mesh = meshh->getMeshes();
	for(uint32 i = 0; i < header->numMeshes; i++){
		findMinVertAndNumVertices(mesh->indices, mesh->numIndices,
		                          &inst->minVert, &inst->numVertices);
		inst->numIndices = mesh->numIndices;
		inst->material = mesh->material;
		inst->vertexShader = 0;
		inst->primType = meshh->flags == 1 ? D3DPT_TRIANGLESTRIP : D3DPT_TRIANGLELIST;
		inst->vertexBuffer = nil;
		inst->baseIndex = 0;	// (maybe) not used by us
		inst->vertexAlpha = 0;
		inst->managed = 0;
		inst->remapped = 0;

		inst->indexBuffer = createIndexBuffer(inst->numIndices*2, false);
		uint16 *indices = lockIndices(inst->indexBuffer, 0, 0, 0);
		if(inst->minVert == 0)
			memcpy(indices, mesh->indices, inst->numIndices*2);
		else
			for(int32 j = 0; j < inst->numIndices; j++)
				indices[j] = mesh->indices[j] - inst->minVert;
		unlockIndices(inst->indexBuffer);

		pipe->instanceCB(geo, inst);
		mesh++;
		inst++;
	}
}